

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v5::internal::sprintf_format<long_double>
               (longdouble value,buffer *buf,core_format_specs spec)

{
  uint uVar1;
  ulong uVar2;
  undefined2 *puVar3;
  char format [10];
  char local_2e;
  undefined1 local_2d [2];
  undefined1 local_2b [7];
  longdouble local_24;
  
  local_24 = value;
  local_2e = '%';
  if (((ulong)spec >> 0x23 & 1) == 0) {
    puVar3 = (undefined2 *)local_2d;
  }
  else {
    puVar3 = (undefined2 *)(local_2d + 1);
    local_2d[0] = 0x23;
  }
  if (-1 < spec.precision) {
    *puVar3 = 0x2a2e;
    puVar3 = puVar3 + 1;
  }
  *(undefined1 *)puVar3 = 0x4c;
  *(char *)((long)puVar3 + 1) = spec.type;
  *(undefined1 *)(puVar3 + 1) = 0;
LAB_0012da2f:
  uVar1 = char_traits<char>::format_float<long_double>
                    (buf->ptr_,buf->capacity_,&local_2e,spec.precision,local_24);
  if ((int)uVar1 < 0) goto LAB_0012da59;
  if ((ulong)uVar1 < buf->capacity_) {
    basic_buffer<char>::resize(buf,(ulong)uVar1);
    return;
  }
  uVar2 = (ulong)(uVar1 + 1);
  goto LAB_0012da66;
LAB_0012da59:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar2 = buf->capacity_ + 1;
LAB_0012da66:
    (**buf->_vptr_basic_buffer)(buf,uVar2);
  }
  goto LAB_0012da2f;
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}